

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O2

void __thiscall Impl1::Impl1(Impl1 *this,double dd,bool throw_on_copy)

{
  __atomic_base<unsigned_long> _Var1;
  int *piVar2;
  
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR___cxa_pure_virtual_002c1838;
  LOCK();
  UNLOCK();
  _Var1._M_i = (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  (this->super_Interface).my_id = (size_t)Interface::last_id.super___atomic_base<unsigned_long>._M_i
  ;
  Interface::last_id.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
  (this->super_Interface).throw_on_copy_construction = throw_on_copy;
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_002c17d8;
  this->d = dd;
  piVar2 = (int *)operator_new__(0x1bc);
  (this->p)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar2;
  (this->cookie).cookie = 0xdeadbeef;
  return;
}

Assistant:

explicit Impl1(double dd = 0.0, bool throw_on_copy = false)
        : Interface { throw_on_copy }
        , d { dd }
        , p { new int[111] }
    {
        cookie.set();
    }